

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

bool __thiscall Spi::eraseFlash(Spi *this)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  int local_2c;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  int local_1c;
  duration<long,_std::ratio<1L,_1000L>_> local_18;
  Spi *local_10;
  Spi *this_local;
  
  local_10 = this;
  fprintf(_stdout,"reset..\n");
  flash_chip_deselect(this);
  local_1c = 0xfa;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_18,&local_1c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_18);
  pFVar1 = _stdout;
  iVar2 = get_cdone(this);
  pcVar3 = "low";
  if (iVar2 != 0) {
    pcVar3 = "high";
  }
  fprintf(pFVar1,"cdone: %s\n",pcVar3);
  flash_reset(this);
  flash_power_up(this);
  flash_read_id(this);
  flash_write_enable(this);
  flash_bulk_erase(this);
  flash_wait(this);
  flash_power_down(this);
  set_gpio(this,1,1);
  local_2c = 0xfa;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_28,&local_2c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_28);
  pFVar1 = _stdout;
  iVar2 = get_cdone(this);
  pcVar3 = "low";
  if (iVar2 != 0) {
    pcVar3 = "high";
  }
  fprintf(pFVar1,"cdone: %s\n",pcVar3);
  return true;
}

Assistant:

bool Spi::eraseFlash() {
	fprintf(stdout, "reset..\n");

	flash_chip_deselect();
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	fprintf(stdout, "cdone: %s\n", get_cdone() ? "high" : "low");

	flash_reset();
	flash_power_up();

	flash_read_id();

	flash_write_enable();
	flash_bulk_erase();
	flash_wait();

	// ---------------------------------------------------------
	// Reset
	// ---------------------------------------------------------

	flash_power_down();

	set_gpio(1, 1);
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	fprintf(stdout, "cdone: %s\n", get_cdone() ? "high" : "low");

	return true;
}